

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uo_json.c
# Opt level: O3

char * uo_json_decode_utf8(char *dst,char *src,size_t src_len)

{
  byte bVar1;
  int iVar2;
  undefined8 in_RAX;
  byte *pbVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  int codepoint;
  undefined8 uStack_38;
  
  if (((src_len < 2) || (*src != '\"')) || (pbVar6 = (byte *)(src + (src_len - 1)), *pbVar6 != 0x22)
     ) {
LAB_001013ea:
    dst = (char *)0x0;
  }
  else if (2 < (long)src_len) {
    pbVar3 = (byte *)dst;
    pbVar4 = (byte *)(src + 1);
    uStack_38 = in_RAX;
    do {
      pbVar5 = pbVar4 + 1;
      if (*pbVar4 == 0x5c) {
        if (pbVar6 <= pbVar5) goto LAB_001013ea;
        bVar1 = pbVar4[1];
        dst = (char *)0x0;
        if (bVar1 < 0x62) {
          if (bVar1 == 0x22) {
            *pbVar3 = 0x22;
          }
          else if (bVar1 == 0x2f) {
            *pbVar3 = 0x2f;
          }
          else {
            if (bVar1 != 0x5c) {
              return (char *)0x0;
            }
            *pbVar3 = 0x5c;
          }
        }
        else {
          switch(bVar1) {
          case 0x6e:
            *pbVar3 = 10;
            break;
          case 0x6f:
          case 0x70:
          case 0x71:
          case 0x73:
            goto switchD_001012e1_caseD_6f;
          case 0x72:
            *pbVar3 = 0xd;
            break;
          case 0x74:
            *pbVar3 = 9;
            break;
          case 0x75:
            pbVar5 = pbVar4 + 6;
            if ((pbVar5 <= pbVar6) &&
               (iVar2 = __isoc99_sscanf(pbVar4 + 2,"%04x",(long)&uStack_38 + 4), iVar2 == 1)) {
              bVar1 = (byte)((ulong)uStack_38 >> 0x20);
              if (uStack_38._4_4_ < 0x80) {
                *pbVar3 = bVar1;
                dst = (char *)(pbVar3 + 1);
              }
              else if (uStack_38._4_4_ < 0x800) {
                *pbVar3 = (byte)(uStack_38._4_4_ >> 6) | 0xc0;
                pbVar3[1] = bVar1 & 0x3f | 0x80;
                dst = (char *)(pbVar3 + 2);
              }
              else if (uStack_38._4_4_ < 0x10000) {
                *pbVar3 = (byte)(uStack_38._4_4_ >> 0xc) | 0xe0;
                pbVar3[1] = (byte)(uStack_38._4_4_ >> 6) & 0x3f | 0x80;
                pbVar3[2] = bVar1 & 0x3f | 0x80;
                dst = (char *)(pbVar3 + 3);
              }
              else if (uStack_38._4_4_ < 0x110000) {
                *pbVar3 = (byte)(uStack_38._4_4_ >> 0x12) | 0xf0;
                pbVar3[1] = (byte)(uStack_38._4_4_ >> 0xc) & 0x3f | 0x80;
                pbVar3[2] = (byte)(uStack_38._4_4_ >> 6) & 0x3f | 0x80;
                pbVar3[3] = bVar1 & 0x3f | 0x80;
                dst = (char *)(pbVar3 + 4);
              }
              else {
                dst = (char *)0x0;
              }
              goto LAB_0010134b;
            }
            goto LAB_001013ea;
          default:
            if (bVar1 == 0x62) {
              *pbVar3 = 8;
            }
            else {
              if (bVar1 != 0x66) {
                return (char *)0x0;
              }
              *pbVar3 = 0xc;
            }
          }
        }
        dst = (char *)(pbVar3 + 1);
        pbVar5 = pbVar4 + 2;
      }
      else {
        *pbVar3 = *pbVar4;
        dst = (char *)(pbVar3 + 1);
      }
LAB_0010134b:
      pbVar3 = (byte *)dst;
      pbVar4 = pbVar5;
    } while (pbVar5 < pbVar6);
  }
switchD_001012e1_caseD_6f:
  return dst;
}

Assistant:

char *uo_json_decode_utf8(
    char *dst,
    const char *src,
    size_t src_len)
{
    const char *json_end = src + src_len - 1;
    unsigned char c;

    if (src_len < 2 || *src++ != '\"' || *json_end != '\"')
        return NULL;

    while (src < json_end)
    {
        if ((c = *src++) == '\\')
        {
            if (src >= json_end)
                return NULL;

            switch (*src++)
            {
                case '"':  *dst++ = '"';  break;
                case '\\': *dst++ = '\\'; break;
                case '/':  *dst++ = '/';  break;
                case 'b':  *dst++ = '\b'; break;
                case 'f':  *dst++ = '\f'; break;
                case 'n':  *dst++ = '\n'; break;
                case 'r':  *dst++ = '\r'; break;
                case 't':  *dst++ = '\t'; break;
                
                case 'u':
                {
                    if (src + 4 > json_end)
                        return NULL;

                    int codepoint;
                    if (sscanf(src, "%04x", &codepoint) != 1)
                        return NULL;

                    src += 4;

                    dst = uo_utf8_append(dst, codepoint);
                    break;
                }

                default: return NULL;
            }
            continue;
        }

        *dst++ = c;
    }

    return dst;
}